

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O3

void pztopology::TPZPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  MEM_CPY<double> *pMVar7;
  long lVar8;
  MEM_CPY<double> *pMVar9;
  Fad<double> *pFVar10;
  long lVar11;
  TPZFMatrix<Fad<double>_> *pTVar12;
  Fad<double> *pFVar13;
  ulong uVar14;
  ulong uVar15;
  MEM_CPY<double> *pMVar16;
  MEM_CPY<double> *pMVar17;
  uint uVar18;
  int i;
  uint uVar19;
  ulong uVar20;
  double dVar21;
  value_type vVar22;
  value_type vVar23;
  Fad<double> lmez;
  Fad<double> lmexmez;
  Fad<double> lmeymez;
  Fad<double> zeta;
  Fad<double> lmaxmez;
  Fad<double> T1yz;
  Fad<double> xi;
  Fad<double> lmaymez;
  Fad<double> T1xz;
  Fad<double> eta;
  Fad<double> T0yz;
  int sz_1;
  int sz;
  Fad<double> T0xz;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_358;
  undefined1 local_348 [8];
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *local_340;
  EVP_PKEY_CTX *pEStack_338;
  Fad<double> *local_330;
  undefined1 local_328 [8];
  Fad<double> *local_320;
  EVP_PKEY_CTX *pEStack_318;
  Fad<double> *local_310;
  undefined1 local_308 [8];
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *local_300;
  EVP_PKEY_CTX *pEStack_2f8;
  Fad<double> *local_2f0;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_2e8;
  double local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b0 [24];
  double local_298;
  undefined1 local_290 [8];
  Vector<double> local_288;
  double local_278;
  undefined1 local_270 [8];
  double local_268;
  double *pdStack_260;
  Fad<double> *local_258;
  undefined1 local_250 [24];
  double local_238;
  undefined1 local_230 [8];
  Vector<double> local_228;
  double local_218;
  undefined1 local_210 [8];
  double local_208;
  double *pdStack_200;
  Fad<double> *local_1f8;
  undefined1 local_1f0 [24];
  double local_1d8;
  double local_1d0;
  TPZFMatrix<Fad<double>_> *local_1c8;
  undefined1 local_1c0 [8];
  double local_1b8;
  double *pdStack_1b0;
  Fad<double> *local_1a8;
  uint local_1a0;
  uint local_19c;
  Fad<double> local_198;
  undefined8 *local_178;
  Fad<double> *local_170;
  undefined8 **local_168;
  Fad<double> *local_160;
  Fad<double> *local_158;
  undefined8 *local_150;
  undefined1 local_148 [16];
  Fad<double> local_138;
  Fad<double> local_118;
  Fad<double> local_f8;
  Fad<double> local_d8;
  double local_b8;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  pFVar13 = loc->fStore;
  local_2c8 = pFVar13->val_;
  uVar18 = (pFVar13->dx_).num_elts;
  local_250._16_8_ = (MEM_CPY<double> *)0x0;
  pFVar10 = pFVar13;
  local_250._0_8_ = local_2c8;
  local_250._8_4_ = uVar18;
  local_1c8 = dphi;
  if ((long)(int)uVar18 != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)uVar18) {
      uVar20 = (long)(int)uVar18 << 3;
    }
    local_250._16_8_ = operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_250._16_8_,(EVP_PKEY_CTX *)(pFVar13->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar18);
    pFVar10 = loc->fStore;
  }
  local_238 = pFVar13->defaultVal;
  local_1f0._0_8_ = pFVar10[1].val_;
  uVar19 = pFVar10[1].dx_.num_elts;
  local_1f0._16_8_ = (MEM_CPY<double> *)0x0;
  pFVar13 = pFVar10;
  local_1f0._8_4_ = uVar19;
  if ((long)(int)uVar19 != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)uVar19) {
      uVar20 = (long)(int)uVar19 * 8;
    }
    local_1f0._16_8_ = operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_1f0._16_8_,(EVP_PKEY_CTX *)pFVar10[1].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar19);
    pFVar13 = loc->fStore;
  }
  local_1d8 = pFVar10[1].defaultVal;
  local_2b0._0_8_ = pFVar13[2].val_;
  uVar19 = pFVar13[2].dx_.num_elts;
  local_2b0._16_8_ = (MEM_CPY<double> *)0x0;
  dVar21 = (double)local_2b0._0_8_;
  local_2b0._8_4_ = uVar19;
  if ((long)(int)uVar19 != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)uVar19) {
      uVar20 = (long)(int)uVar19 << 3;
    }
    local_1d0 = (double)local_2b0._0_8_;
    local_2b0._16_8_ = operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_2b0._16_8_,(EVP_PKEY_CTX *)pFVar13[2].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar19);
    dVar21 = local_1d0;
  }
  local_298 = pFVar13[2].defaultVal;
  if (1.0 < dVar21) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
               ,0x11e);
  }
  local_328 = (undefined1  [8])local_210;
  local_208 = 1.0;
  pdStack_200 = (double *)0x0;
  local_1a8 = (Fad<double> *)local_328;
  local_320 = (Fad<double> *)local_250;
  local_348 = (undefined1  [8])local_1c0;
  local_1b8 = 0.5;
  pdStack_1b0 = (double *)0x0;
  local_340 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_270;
  local_268 = 1.0;
  pdStack_260 = (double *)0x0;
  dVar21 = 1.0 - dVar21;
  local_198.val_ = ((dVar21 - local_2c8) * 0.5) / dVar21;
  if ((int)uVar18 < (int)uVar19) {
    uVar18 = uVar19;
  }
  local_198.dx_.num_elts = 0;
  local_198.dx_.ptr_to_data = (double *)0x0;
  if ((int)uVar18 < 1) {
    local_198.defaultVal = 0.0;
  }
  else {
    local_258 = (Fad<double> *)local_2b0;
    local_1f8 = (Fad<double> *)local_2b0;
    local_198.dx_.num_elts = uVar18;
    local_198.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar18 * 8);
    local_198.defaultVal = 0.0;
    uVar20 = 0;
    do {
      vVar22 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
               ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                     *)local_348,(int)uVar20);
      local_198.dx_.ptr_to_data[uVar20] = vVar22;
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
    dVar21 = 1.0 - (double)local_2b0._0_8_;
    uVar19 = local_2b0._8_4_;
  }
  dVar4 = local_1b8;
  local_268 = 1.0;
  pdStack_260 = (double *)0x0;
  local_1f8 = (Fad<double> *)local_308;
  local_308 = (undefined1  [8])local_270;
  local_208 = 0.5;
  pdStack_200 = (double *)0x0;
  local_320 = (Fad<double> *)local_348;
  local_340 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pEStack_338 = (EVP_PKEY_CTX *)0x0;
  local_328 = (undefined1  [8])local_210;
  local_1c0 = (undefined1  [8])(((dVar21 - (double)local_1f0._0_8_) * 0.5) / dVar21);
  uVar18 = local_1f0._8_4_;
  if ((int)local_1f0._8_4_ < (int)uVar19) {
    uVar18 = uVar19;
  }
  local_1b8 = (double)((ulong)local_1b8 & 0xffffffff00000000);
  pdStack_1b0 = (double *)0x0;
  if ((int)uVar18 < 1) {
    local_1a8 = (Fad<double> *)0x0;
  }
  else {
    local_1b8 = (double)CONCAT44(SUB84(dVar4,4),uVar18);
    local_330 = (Fad<double> *)local_2b0;
    local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1f0;
    local_258 = (Fad<double> *)local_2b0;
    pdStack_1b0 = (double *)operator_new__((ulong)uVar18 * 8);
    local_1a8 = (Fad<double> *)0x0;
    uVar20 = 0;
    do {
      vVar22 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
               ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                     *)local_328,(int)uVar20);
      pdStack_1b0[uVar20] = vVar22;
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
    dVar21 = 1.0 - (double)local_2b0._0_8_;
    uVar19 = local_2b0._8_4_;
  }
  dVar4 = local_208;
  local_340 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pEStack_338 = (EVP_PKEY_CTX *)0x0;
  local_258 = (Fad<double> *)local_290;
  local_290 = (undefined1  [8])local_348;
  local_288._0_8_ = local_250;
  local_268 = 0.5;
  pdStack_260 = (double *)0x0;
  local_320 = (Fad<double> *)0x3ff0000000000000;
  pEStack_318 = (EVP_PKEY_CTX *)0x0;
  local_308 = (undefined1  [8])local_270;
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_328;
  local_210 = (undefined1  [8])((((double)local_250._0_8_ + dVar21) * 0.5) / dVar21);
  uVar18 = local_250._8_4_;
  if ((int)local_250._8_4_ < (int)uVar19) {
    uVar18 = uVar19;
  }
  local_208 = (double)((ulong)local_208 & 0xffffffff00000000);
  pdStack_200 = (double *)0x0;
  if ((int)uVar18 < 1) {
    local_1f8 = (Fad<double> *)0x0;
  }
  else {
    local_208 = (double)CONCAT44(SUB84(dVar4,4),uVar18);
    local_330 = (Fad<double> *)local_2b0;
    local_310 = (Fad<double> *)local_2b0;
    pdStack_200 = (double *)operator_new__((ulong)uVar18 * 8);
    local_1f8 = (Fad<double> *)0x0;
    uVar20 = 0;
    do {
      vVar23 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
               ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                     *)local_308,(int)uVar20);
      pdStack_200[uVar20] = vVar23;
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
    dVar21 = 1.0 - (double)local_2b0._0_8_;
    uVar19 = local_2b0._8_4_;
  }
  dVar4 = local_268;
  local_320 = (Fad<double> *)0x3ff0000000000000;
  pEStack_318 = (EVP_PKEY_CTX *)0x0;
  local_330 = (Fad<double> *)local_230;
  local_230 = (undefined1  [8])local_328;
  local_340 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3fe0000000000000;
  pEStack_338 = (EVP_PKEY_CTX *)0x0;
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pEStack_2f8 = (EVP_PKEY_CTX *)0x0;
  local_290 = (undefined1  [8])local_348;
  local_270 = (undefined1  [8])((((double)local_1f0._0_8_ + dVar21) * 0.5) / dVar21);
  uVar18 = local_1f0._8_4_;
  if ((int)local_1f0._8_4_ < (int)uVar19) {
    uVar18 = uVar19;
  }
  local_268 = (double)((ulong)local_268 & 0xffffffff00000000);
  pdStack_260 = (double *)0x0;
  local_2f0 = (Fad<double> *)local_2b0;
  local_288._0_8_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_308;
  local_228._0_8_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1f0;
  if ((int)uVar18 < 1) {
    local_258 = (Fad<double> *)0x0;
    local_310 = (Fad<double> *)local_2b0;
  }
  else {
    local_268 = (double)CONCAT44(SUB84(dVar4,4),uVar18);
    local_310 = (Fad<double> *)local_2b0;
    pdStack_260 = (double *)operator_new__((ulong)uVar18 * 8);
    local_258 = (Fad<double> *)0x0;
    uVar20 = 0;
    do {
      vVar23 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
               ::dx((FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                     *)local_290,(int)uVar20);
      pdStack_260[uVar20] = vVar23;
      uVar20 = uVar20 + 1;
    } while (uVar18 != uVar20);
  }
  uVar2 = local_250._8_4_;
  local_50.val_ = (double)local_250._0_8_;
  local_50.dx_.num_elts = local_250._8_4_;
  local_50.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_250._8_4_ != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)local_250._8_4_) {
      uVar20 = (long)(int)local_250._8_4_ * 8;
    }
    local_50.dx_.ptr_to_data = (double *)operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_50.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_250._16_8_,
               (EVP_PKEY_CTX *)(ulong)(uint)uVar2);
  }
  local_50.defaultVal = local_238;
  local_2c8 = ABS(local_50.val_);
  uStack_2c0 = 0;
  Fad<double>::~Fad(&local_50);
  if (local_2c8 < 1e-12) {
    local_198.val_ = 0.5;
    if (local_198.dx_.num_elts != 0) {
      local_348 = (undefined1  [8])0x0;
      Vector<double>::operator=(&local_198.dx_,(double *)local_348);
    }
    local_210 = (undefined1  [8])0x3fe0000000000000;
    if (local_208._0_4_ != 0) {
      local_348 = (undefined1  [8])0x0;
      Vector<double>::operator=((Vector<double> *)&local_208,(double *)local_348);
    }
  }
  uVar2 = local_1f0._8_4_;
  local_70.val_ = (double)local_1f0._0_8_;
  local_70.dx_.num_elts = local_1f0._8_4_;
  local_70.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_1f0._8_4_ != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)local_1f0._8_4_) {
      uVar20 = (long)(int)local_1f0._8_4_ * 8;
    }
    local_70.dx_.ptr_to_data = (double *)operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_70.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_1f0._16_8_,
               (EVP_PKEY_CTX *)(ulong)(uint)uVar2);
  }
  local_70.defaultVal = local_1d8;
  local_2c8 = ABS(local_70.val_);
  uStack_2c0 = 0;
  Fad<double>::~Fad(&local_70);
  if (local_2c8 < 1e-12) {
    local_1c0 = (undefined1  [8])0x3fe0000000000000;
    if (local_1b8._0_4_ != 0) {
      local_348 = (undefined1  [8])0x0;
      Vector<double>::operator=((Vector<double> *)&local_1b8,(double *)local_348);
    }
    local_270 = (undefined1  [8])0x3fe0000000000000;
    if (local_268._0_4_ != 0) {
      local_348 = (undefined1  [8])0x0;
      Vector<double>::operator=((Vector<double> *)&local_268,(double *)local_348);
    }
  }
  pFVar1 = local_340;
  local_348 = (undefined1  [8])(1.0 - (double)local_2b0._0_8_);
  lVar11 = (long)(int)local_2b0._8_4_;
  local_340 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
              ((ulong)local_340 & 0xffffffff00000000);
  pEStack_338 = (EVP_PKEY_CTX *)0x0;
  if (0 < lVar11) {
    local_340 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                CONCAT44(SUB84(pFVar1,4),local_2b0._8_4_);
    pEStack_338 = (EVP_PKEY_CTX *)operator_new__(lVar11 * 8);
    lVar8 = 0;
    do {
      *(ulong *)(pEStack_338 + lVar8 * 8) =
           *(ulong *)(local_2b0._16_8_ + lVar8 * 8) ^ 0x8000000000000000;
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  local_330 = (Fad<double> *)0x0;
  local_320 = (Fad<double> *)local_348;
  local_328 = (undefined1  [8])local_308;
  local_308 = (undefined1  [8])&local_198;
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1c0;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (phi->fElem,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_328);
  local_308 = (undefined1  [8])local_210;
  local_320 = (Fad<double> *)local_348;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_328 = (undefined1  [8])local_308;
    local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1c0;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_328 = (undefined1  [8])local_308;
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_1c0;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_328);
  local_308 = (undefined1  [8])local_210;
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_270;
  local_320 = (Fad<double> *)local_348;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_328 = (undefined1  [8])local_308;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_328 = (undefined1  [8])local_308;
  Fad<double>::operator=
            (phi->fElem + 2,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_328);
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)local_270;
  local_320 = (Fad<double> *)local_348;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_328 = (undefined1  [8])local_308;
    local_308 = (undefined1  [8])&local_198;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_328 = (undefined1  [8])local_308;
  local_308 = (undefined1  [8])&local_198;
  Fad<double>::operator=
            (phi->fElem + 3,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)local_328);
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar13 = phi->fElem;
  pFVar13[4].val_ = (double)local_2b0._0_8_;
  Vector<double>::operator=(&pFVar13[4].dx_,(Vector<double> *)(local_2b0 + 8));
  uVar5 = local_250._8_4_;
  uVar2 = local_2b0._8_4_;
  pFVar10 = local_320;
  pFVar13[4].defaultVal = local_298;
  local_1d0 = (double)local_250._0_8_;
  local_328 = (undefined1  [8])((1.0 - (double)local_250._0_8_) - (double)local_2b0._0_8_);
  local_19c = local_2b0._8_4_;
  if ((int)local_2b0._8_4_ < (int)local_250._8_4_) {
    local_19c = local_250._8_4_;
  }
  local_320 = (Fad<double> *)((ulong)local_320 & 0xffffffff00000000);
  pEStack_318 = (EVP_PKEY_CTX *)0x0;
  uVar20 = (ulong)local_19c;
  local_2c8 = (double)local_2b0._0_8_;
  if (0 < (int)local_19c) {
    local_320 = (Fad<double> *)CONCAT44(SUB84(pFVar10,4),local_19c);
    pEStack_318 = (EVP_PKEY_CTX *)operator_new__(uVar20 * 8);
    uVar14 = 0;
    pMVar7 = (MEM_CPY<double> *)local_250._16_8_;
    pMVar9 = (MEM_CPY<double> *)local_2b0._16_8_;
    do {
      pMVar17 = pMVar7;
      if (uVar5 == 0) {
        pMVar17 = (MEM_CPY<double> *)&local_238;
      }
      pMVar16 = pMVar9;
      if (uVar2 == 0) {
        pMVar16 = (MEM_CPY<double> *)&local_298;
      }
      *(double *)(pEStack_318 + uVar14 * 8) = -*(double *)pMVar17 - *(double *)pMVar16;
      uVar14 = uVar14 + 1;
      pMVar9 = pMVar9 + 8;
      pMVar7 = pMVar7 + 8;
    } while (uVar20 != uVar14);
  }
  uVar6 = local_1f0._8_4_;
  pFVar1 = local_300;
  local_310 = (Fad<double> *)0x0;
  local_b8 = (double)local_1f0._0_8_;
  local_308 = (undefined1  [8])((1.0 - (double)local_1f0._0_8_) - local_2c8);
  local_1a0 = uVar2;
  if ((int)uVar2 < (int)local_1f0._8_4_) {
    local_1a0 = local_1f0._8_4_;
  }
  local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
              ((ulong)local_300 & 0xffffffff00000000);
  pEStack_2f8 = (EVP_PKEY_CTX *)0x0;
  uVar14 = (ulong)local_1a0;
  if (0 < (int)local_1a0) {
    local_300 = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                CONCAT44(SUB84(pFVar1,4),local_1a0);
    pEStack_2f8 = (EVP_PKEY_CTX *)operator_new__(uVar14 * 8);
    uVar15 = 0;
    pMVar7 = (MEM_CPY<double> *)local_1f0._16_8_;
    pMVar9 = (MEM_CPY<double> *)local_2b0._16_8_;
    do {
      pMVar17 = pMVar7;
      if (uVar6 == 0) {
        pMVar17 = (MEM_CPY<double> *)&local_1d8;
      }
      pMVar16 = pMVar9;
      if (uVar2 == 0) {
        pMVar16 = (MEM_CPY<double> *)&local_298;
      }
      *(double *)(pEStack_2f8 + uVar15 * 8) = -*(double *)pMVar17 - *(double *)pMVar16;
      uVar15 = uVar15 + 1;
      pMVar9 = pMVar9 + 8;
      pMVar7 = pMVar7 + 8;
    } while (uVar14 != uVar15);
  }
  uVar3 = local_288._0_8_;
  local_2f0 = (Fad<double> *)0x0;
  local_290 = (undefined1  [8])((local_1d0 + 1.0) - local_2c8);
  local_288._0_8_ = local_288._0_8_ & 0xffffffff00000000;
  local_288.ptr_to_data = (double *)0x0;
  if (0 < (int)local_19c) {
    local_288._4_4_ = SUB84(uVar3,4);
    local_288.num_elts = local_19c;
    local_288.ptr_to_data = (double *)operator_new__(uVar20 * 8);
    local_278 = 0.0;
    uVar15 = 0;
    pMVar7 = (MEM_CPY<double> *)local_250._16_8_;
    pMVar9 = (MEM_CPY<double> *)local_2b0._16_8_;
    do {
      pMVar17 = pMVar7;
      if (uVar5 == 0) {
        pMVar17 = (MEM_CPY<double> *)&local_238;
      }
      pMVar16 = pMVar9;
      if (uVar2 == 0) {
        pMVar16 = (MEM_CPY<double> *)&local_298;
      }
      *(double *)((long)local_288.ptr_to_data + uVar15 * 8) =
           *(double *)pMVar17 - *(double *)pMVar16;
      uVar15 = uVar15 + 1;
      pMVar9 = pMVar9 + 8;
      pMVar7 = pMVar7 + 8;
    } while (uVar20 != uVar15);
  }
  uVar3 = local_228._0_8_;
  local_278 = 0.0;
  local_230 = (undefined1  [8])((local_b8 + 1.0) - local_2c8);
  local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
  local_228.ptr_to_data = (double *)0x0;
  if (0 < (int)local_1a0) {
    local_228._4_4_ = SUB84(uVar3,4);
    local_228.num_elts = local_1a0;
    local_228.ptr_to_data = (double *)operator_new__(uVar14 * 8);
    local_218 = 0.0;
    uVar20 = 0;
    pMVar7 = (MEM_CPY<double> *)local_1f0._16_8_;
    pMVar9 = (MEM_CPY<double> *)local_2b0._16_8_;
    do {
      pMVar17 = pMVar7;
      if (uVar6 == 0) {
        pMVar17 = (MEM_CPY<double> *)&local_1d8;
      }
      pMVar16 = pMVar9;
      if (uVar2 == 0) {
        pMVar16 = (MEM_CPY<double> *)&local_298;
      }
      *(double *)((long)local_228.ptr_to_data + uVar20 * 8) =
           *(double *)pMVar17 - *(double *)pMVar16;
      uVar20 = uVar20 + 1;
      pMVar9 = pMVar9 + 8;
      pMVar7 = pMVar7 + 8;
    } while (uVar14 != uVar20);
  }
  pTVar12 = local_1c8;
  pFVar1 = local_340;
  local_218 = 0.0;
  local_d8.val_ = (double)local_348;
  local_d8.dx_.num_elts = (int)local_340;
  local_d8.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_340 != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)local_340) {
      uVar20 = (long)(int)local_340 * 8;
    }
    local_d8.dx_.ptr_to_data = (double *)operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_d8.dx_.ptr_to_data,pEStack_338,
               (EVP_PKEY_CTX *)((ulong)pFVar1 & 0xffffffff));
  }
  pFVar13 = local_320;
  local_d8.defaultVal = (double)local_330;
  if (ABS(local_d8.val_) < 1e-12) {
    local_f8.val_ = (double)local_328;
    local_f8.dx_.num_elts = (int)local_320;
    local_f8.dx_.ptr_to_data = (double *)0x0;
    if ((long)(int)local_320 != 0) {
      uVar20 = 0xffffffffffffffff;
      if (-1 < (int)local_320) {
        uVar20 = (long)(int)local_320 * 8;
      }
      local_f8.dx_.ptr_to_data = (double *)operator_new__(uVar20);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_f8.dx_.ptr_to_data,pEStack_318,
                 (EVP_PKEY_CTX *)((ulong)pFVar13 & 0xffffffff));
    }
    pFVar1 = local_300;
    local_f8.defaultVal = (double)local_310;
    if (1e-12 <= ABS(local_f8.val_)) {
      local_118.val_ = (double)local_308;
      local_118.dx_.num_elts = (int)local_300;
      local_118.dx_.ptr_to_data = (double *)0x0;
      if ((long)(int)local_300 != 0) {
        uVar20 = 0xffffffffffffffff;
        if (-1 < (int)local_300) {
          uVar20 = (long)(int)local_300 * 8;
        }
        local_118.dx_.ptr_to_data = (double *)operator_new__(uVar20);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_118.dx_.ptr_to_data,pEStack_2f8,
                   (EVP_PKEY_CTX *)((ulong)pFVar1 & 0xffffffff));
      }
      uVar3 = local_288._0_8_;
      local_118.defaultVal = (double)local_2f0;
      if (1e-12 <= ABS(local_118.val_)) {
        local_138.val_ = (double)local_290;
        local_138.dx_.num_elts = local_288.num_elts;
        local_138.dx_.ptr_to_data = (double *)0x0;
        if ((long)local_288.num_elts != 0) {
          uVar20 = 0xffffffffffffffff;
          if (-1 < local_288.num_elts) {
            uVar20 = (long)local_288.num_elts * 8;
          }
          local_138.dx_.ptr_to_data = (double *)operator_new__(uVar20);
          MEM_CPY<double>::copy
                    ((MEM_CPY<double> *)local_138.dx_.ptr_to_data,
                     (EVP_PKEY_CTX *)local_288.ptr_to_data,(EVP_PKEY_CTX *)(uVar3 & 0xffffffff));
        }
        uVar3 = local_228._0_8_;
        local_138.defaultVal = local_278;
        if (1e-12 <= ABS(local_138.val_)) {
          local_90.val_ = (double)local_230;
          local_90.dx_.num_elts = local_228.num_elts;
          local_90.dx_.ptr_to_data = (double *)0x0;
          if ((long)local_228.num_elts != 0) {
            uVar20 = 0xffffffffffffffff;
            if (-1 < local_228.num_elts) {
              uVar20 = (long)local_228.num_elts * 8;
            }
            local_90.dx_.ptr_to_data = (double *)operator_new__(uVar20);
            MEM_CPY<double>::copy
                      ((MEM_CPY<double> *)local_90.dx_.ptr_to_data,
                       (EVP_PKEY_CTX *)local_228.ptr_to_data,(EVP_PKEY_CTX *)(uVar3 & 0xffffffff));
          }
          local_90.defaultVal = local_218;
          local_2c8 = ABS(local_90.val_);
          uStack_2c0 = 0;
          Fad<double>::~Fad(&local_90);
          Fad<double>::~Fad(&local_138);
          Fad<double>::~Fad(&local_118);
          Fad<double>::~Fad(&local_f8);
          Fad<double>::~Fad(&local_d8);
          if (1e-12 <= local_2c8) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
                       ,0x13c);
          }
          goto LAB_00de1f9e;
        }
        Fad<double>::~Fad(&local_138);
      }
      Fad<double>::~Fad(&local_118);
    }
    Fad<double>::~Fad(&local_f8);
  }
  Fad<double>::~Fad(&local_d8);
LAB_00de1f9e:
  pFVar1 = local_340;
  local_b0.val_ = (double)local_348;
  local_b0.dx_.num_elts = (int)local_340;
  local_b0.dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)local_340 != 0) {
    uVar20 = 0xffffffffffffffff;
    if (-1 < (int)local_340) {
      uVar20 = (long)(int)local_340 * 8;
    }
    local_b0.dx_.ptr_to_data = (double *)operator_new__(uVar20);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_b0.dx_.ptr_to_data,pEStack_338,
               (EVP_PKEY_CTX *)((ulong)pFVar1 & 0xffffffff));
  }
  local_b0.defaultVal = (double)local_330;
  local_2c8 = ABS(local_b0.val_);
  uStack_2c0 = 0;
  Fad<double>::~Fad(&local_b0);
  if (local_2c8 < 1e-12) {
    local_328 = (undefined1  [8])0x3feff7ced916872b;
    if ((int)local_320 != 0) {
      local_2e8._0_8_ = 0;
      Vector<double>::operator=((Vector<double> *)&local_320,(double *)&local_2e8);
    }
    local_308 = (undefined1  [8])0x3feff7ced916872b;
    if ((int)local_300 != 0) {
      local_2e8._0_8_ = 0;
      Vector<double>::operator=((Vector<double> *)&local_300,(double *)&local_2e8);
    }
    local_290 = (undefined1  [8])0x3feff7ced916872b;
    if (local_288.num_elts != 0) {
      local_2e8._0_8_ = 0;
      Vector<double>::operator=(&local_288,(double *)&local_2e8);
    }
    pTVar12 = local_1c8;
    local_230 = (undefined1  [8])0x3feff7ced916872b;
    if (local_228.num_elts != 0) {
      local_2e8._0_8_ = 0;
      Vector<double>::operator=(&local_228,(double *)&local_2e8);
    }
    local_348 = (undefined1  [8])0x3f50624dd2f1a9fc;
    if ((int)local_340 != 0) {
      local_2e8._0_8_ = 0;
      Vector<double>::operator=((Vector<double> *)&local_340,(double *)&local_2e8);
    }
  }
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  local_358.fadexpr_.left_ = &local_2e8;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_308;
  if (((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(pTVar12->fElem,&local_358);
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_328;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  if (((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + 1,&local_358);
  local_178 = (undefined8 *)local_328;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_170 = (Fad<double> *)local_308;
  local_168 = &local_178;
  local_160 = local_358.fadexpr_.right_;
  local_158 = (Fad<double> *)local_308;
  local_150 = local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  if (((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=
            (pTVar12->fElem + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_358);
  local_2e8.fadexpr_.left_.constant_ = 0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_308;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 1) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + lVar11,&local_358);
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_290;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 2) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + lVar11 + 1,&local_358);
  local_170 = (Fad<double> *)local_308;
  local_178 = (undefined8 *)local_290;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_160 = local_358.fadexpr_.right_;
  local_158 = local_170;
  local_150 = local_178;
  if ((lVar11 < 3) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_358.fadexpr_.left_ = &local_2e8;
    local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
    local_168 = &local_178;
    local_148._0_8_ = &local_158;
    local_148._8_8_ = &local_168;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_168 = &local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  Fad<double>::operator=
            (pTVar12->fElem + lVar11 + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_358);
  local_2e8.fadexpr_.left_.constant_ = 0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_230;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 1) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + lVar11 * 2,&local_358);
  local_2e8.fadexpr_.left_.constant_ = 0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_290;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 2) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + lVar11 * 2 + 1,&local_358);
  local_170 = (Fad<double> *)local_230;
  local_178 = (undefined8 *)local_290;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_160 = local_358.fadexpr_.right_;
  local_158 = local_170;
  local_150 = local_178;
  if ((lVar11 < 3) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_358.fadexpr_.left_ = &local_2e8;
    local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
    local_168 = &local_178;
    local_148._0_8_ = &local_158;
    local_148._8_8_ = &local_168;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_168 = &local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  Fad<double>::operator=
            (pTVar12->fElem + lVar11 * 2 + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_358);
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_230;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 1) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + lVar11 * 3,&local_358);
  local_2e8.fadexpr_.left_.constant_ = 0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_328;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 2) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_358.fadexpr_.left_ = &local_2e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  Fad<double>::operator=(pTVar12->fElem + lVar11 * 3 + 1,&local_358);
  local_170 = (Fad<double> *)local_230;
  local_178 = (undefined8 *)local_328;
  local_358.fadexpr_.right_ = (Fad<double> *)local_348;
  local_2e8.fadexpr_.left_.constant_ = -0.25;
  local_2e8.fadexpr_.left_.defaultVal = 0.0;
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_160 = local_358.fadexpr_.right_;
  local_158 = local_170;
  local_150 = local_178;
  if ((lVar11 < 3) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_358.fadexpr_.left_ = &local_2e8;
    local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
    local_168 = &local_178;
    local_148._0_8_ = &local_158;
    local_148._8_8_ = &local_168;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_358.fadexpr_.left_ = &local_2e8;
  local_2e8.fadexpr_.right_ = (Fad<double> *)local_148;
  local_168 = &local_178;
  local_148._0_8_ = &local_158;
  local_148._8_8_ = &local_168;
  Fad<double>::operator=
            (pTVar12->fElem + lVar11 * 3 + 2,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
              *)&local_358);
  lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar11 < 1) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar13 = pTVar12->fElem;
  pFVar13[lVar11 * 4].val_ = 0.0;
  if (pFVar13[lVar11 * 4].dx_.num_elts != 0) {
    local_2e8._0_8_ = 0;
    Vector<double>::operator=(&pFVar13[lVar11 * 4].dx_,(double *)&local_2e8);
    lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  if ((lVar11 < 2) || ((pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar13 = pTVar12->fElem;
  pFVar13[lVar11 * 4 + 1].val_ = 0.0;
  if (pFVar13[lVar11 * 4 + 1].dx_.num_elts != 0) {
    local_2e8._0_8_ = 0;
    Vector<double>::operator=(&pFVar13[lVar11 * 4 + 1].dx_,(double *)&local_2e8);
    lVar11 = (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  if ((2 < lVar11) && (4 < (pTVar12->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    pFVar13 = pTVar12->fElem;
    pFVar13[lVar11 * 4 + 2].val_ = 1.0;
    if (pFVar13[lVar11 * 4 + 2].dx_.num_elts != 0) {
      local_2e8._0_8_ = 0;
      Vector<double>::operator=(&pFVar13[lVar11 * 4 + 2].dx_,(double *)&local_2e8);
    }
    Fad<double>::~Fad((Fad<double> *)local_230);
    Fad<double>::~Fad((Fad<double> *)local_290);
    Fad<double>::~Fad((Fad<double> *)local_308);
    Fad<double>::~Fad((Fad<double> *)local_328);
    Fad<double>::~Fad((Fad<double> *)local_348);
    Fad<double>::~Fad((Fad<double> *)local_270);
    Fad<double>::~Fad((Fad<double> *)local_210);
    Fad<double>::~Fad((Fad<double> *)local_1c0);
    Fad<double>::~Fad(&local_198);
    Fad<double>::~Fad((Fad<double> *)local_2b0);
    Fad<double>::~Fad((Fad<double> *)local_1f0);
    Fad<double>::~Fad((Fad<double> *)local_250);
    return;
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZPyramid::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T xi = loc[0], eta = loc[1] , zeta  = loc[2];

        if (zeta> 1.) {
            DebugStop();
        }

        T T0xz = .5*(1.-zeta-xi) / (1.-zeta);
        T T0yz = .5*(1.-zeta-eta) / (1.-zeta);
        T T1xz = .5*(1.-zeta+xi) / (1.-zeta);
        T T1yz = .5*(1.-zeta+eta) / (1.-zeta);
        if (IsZero(xi)) {
            T0xz = 0.5;
            T1xz = 0.5;
        }
        if (IsZero(eta)) {
            T0yz = 0.5;
            T1yz = 0.5;
        }
        T lmez = (1.-zeta);

        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = zeta;

        T lmexmez = 1.-xi-zeta;
        T lmeymez = 1.-eta-zeta;
        T lmaxmez = 1.+xi-zeta;
        T lmaymez = 1.+eta-zeta;

        if (IsZero(lmez) && !IsZero(lmexmez) && !IsZero(lmeymez) &&
            !IsZero(lmaxmez) && !IsZero(lmaymez)) {
            DebugStop();
        }
        if (IsZero(lmez)) {
            lmexmez = 0.999;
            lmeymez = 0.999;
            lmaxmez = 0.999;
            lmaymez = 0.999;
            lmez = 0.001;
        }

        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;

    }